

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::assign
          (CImg<unsigned_int> *this,uint *values,uint size_x,uint size_y,uint size_z,uint size_c)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint in_ECX;
  uint in_EDX;
  uint *in_RSI;
  CImg<unsigned_int> *in_RDI;
  uint in_R8D;
  uint in_R9D;
  uint *new_data;
  uint curr_siz;
  uint siz;
  CImg<unsigned_int> *in_stack_fffffffffffffef0;
  uint *__src;
  CImg<unsigned_int> *pCVar4;
  CImg<unsigned_int> *in_stack_ffffffffffffffd0;
  
  uVar1 = in_EDX * in_ECX * in_R8D * in_R9D;
  if ((in_RSI == (uint *)0x0) || (uVar1 == 0)) {
    in_RDI = assign(in_stack_fffffffffffffef0);
  }
  else {
    pCVar4 = in_RDI;
    uVar2 = size(in_RDI);
    if ((in_RSI == in_RDI->_data) && (uVar1 == uVar2)) {
      in_RDI = assign(in_stack_ffffffffffffffd0,(uint)((ulong)pCVar4 >> 0x20),(uint)pCVar4,
                      (uint)((ulong)in_RSI >> 0x20),(uint)in_RSI);
    }
    else {
      __src = in_RSI;
      if ((((in_RDI->_is_shared & 1U) == 0) && (in_RDI->_data <= in_RSI + uVar1)) &&
         (puVar3 = in_RDI->_data, uVar2 = size(in_RDI), in_RSI < puVar3 + uVar2)) {
        puVar3 = (uint *)operator_new__((ulong)uVar1 << 2);
        memcpy(puVar3,__src,(ulong)uVar1 << 2);
        if (in_RDI->_data != (uint *)0x0) {
          operator_delete__(in_RDI->_data);
        }
        in_RDI->_data = puVar3;
        in_RDI->_width = in_EDX;
        in_RDI->_height = in_ECX;
        in_RDI->_depth = in_R8D;
        in_RDI->_spectrum = in_R9D;
      }
      else {
        assign(in_stack_ffffffffffffffd0,(uint)((ulong)pCVar4 >> 0x20),(uint)pCVar4,
               (uint)((ulong)__src >> 0x20),(uint)__src);
        if ((in_RDI->_is_shared & 1U) == 0) {
          memcpy(in_RDI->_data,__src,(ulong)uVar1 << 2);
        }
        else {
          memmove(in_RDI->_data,__src,(ulong)uVar1 << 2);
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

CImg<T>& assign(const T *const values, const unsigned int size_x, const unsigned int size_y=1,
                    const unsigned int size_z=1, const unsigned int size_c=1) {
      const unsigned int siz = size_x*size_y*size_z*size_c;
      if (!values || !siz) return assign();
      const unsigned int curr_siz = size();
      if (values==_data && siz==curr_siz) return assign(size_x,size_y,size_z,size_c);
      if (_is_shared || values+siz<_data || values>=_data+size()) {
        assign(size_x,size_y,size_z,size_c);
        if (_is_shared) std::memmove(_data,values,siz*sizeof(T));
        else std::memcpy(_data,values,siz*sizeof(T));
      } else {
        T *new_data = 0;
        try { new_data = new T[siz]; } catch (...) {
          _width = _height = _depth = _spectrum = 0; _data = 0;
          throw CImgInstanceException(_cimg_instance
                                      "assign() : Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                      cimg_instance,
                                      cimg::strbuffersize(size_x*size_y*size_z*size_c*sizeof(T)),size_x,size_y,size_z,size_c);
        }
        std::memcpy(new_data,values,siz*sizeof(T));
        delete[] _data; _data = new_data; _width = size_x; _height = size_y; _depth = size_z; _spectrum = size_c;
      }
      return *this;
    }